

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDocument.cpp
# Opt level: O0

string * __thiscall iDynTree::XMLDocument::description_abi_cxx11_(XMLDocument *this)

{
  bool bVar1;
  pointer this_00;
  string *in_RDI;
  ostringstream str;
  XMLElement *in_stack_000000a8;
  string local_1a8 [32];
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  this_00 = std::
            unique_ptr<iDynTree::XMLDocument::XMLDocumentPimpl,_std::default_delete<iDynTree::XMLDocument::XMLDocumentPimpl>_>
            ::operator->((unique_ptr<iDynTree::XMLDocument::XMLDocumentPimpl,_std::default_delete<iDynTree::XMLDocument::XMLDocumentPimpl>_>
                          *)0x135e09);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_00);
  if (bVar1) {
    std::
    unique_ptr<iDynTree::XMLDocument::XMLDocumentPimpl,_std::default_delete<iDynTree::XMLDocument::XMLDocumentPimpl>_>
    ::operator->((unique_ptr<iDynTree::XMLDocument::XMLDocumentPimpl,_std::default_delete<iDynTree::XMLDocument::XMLDocumentPimpl>_>
                  *)0x135e25);
    std::__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x135e2d);
    XMLElement::description_abi_cxx11_(in_stack_000000a8);
    std::operator<<((ostream *)local_188,local_1a8);
    std::__cxx11::string::~string(local_1a8);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string XMLDocument::description() const
    {
        std::ostringstream str;
        if (m_pimpl->m_root) {
            str << m_pimpl->m_root->description();
        }
        return str.str();
    }